

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O1

void __thiscall QTipLabel::updateSize(QTipLabel *this,QPoint *pos)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  QPoint QVar4;
  int extraout_EDX;
  long lVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QFontMetrics fm;
  QString local_50;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetPrivate::setScreenForPoint
            (*(QWidgetPrivate **)&(this->super_QLabel).super_QFrame.super_QWidget.field_0x8,pos);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics
            ((QFontMetrics *)&local_38,&((this->super_QLabel).super_QFrame.super_QWidget.data)->fnt)
  ;
  iVar2 = QFontMetrics::descent();
  if (iVar2 == 2) {
    iVar2 = QFontMetrics::ascent();
    lVar5 = (ulong)(10 < iVar2) << 0x20;
  }
  else {
    lVar5 = 0;
  }
  QLabel::text(&local_50,&this->super_QLabel);
  QVar6.m_size = local_50.d.size | 0x8000000000000000;
  QVar6.field_0.m_data_utf16 = local_50.d.ptr;
  bVar1 = (bool)Qt::mightBeRichText(QVar6);
  QLabel::setWordWrap(&this->super_QLabel,bVar1);
  if ((QSize)local_50.d.d != (QSize)0x0) {
    LOCK();
    *(int *)local_50.d.d = *(int *)local_50.d.d + -1;
    UNLOCK();
    if (*(int *)local_50.d.d == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar3 = (**(code **)(*(long *)&(this->super_QLabel).super_QFrame.super_QWidget + 0x70))(this);
  QVar4 = (QPoint)QWidget::screen((QWidget *)this);
  QScreen::virtualSiblingAt(QVar4);
  bVar1 = QLabel::wordWrap(&this->super_QLabel);
  if ((!bVar1) && (iVar2 = QScreen::geometry(), (extraout_EDX - iVar2) + 1 < (int)lVar3)) {
    QLabel::setWordWrap(&this->super_QLabel,true);
    lVar3 = (**(code **)(*(long *)&(this->super_QLabel).super_QFrame.super_QWidget + 0x70))(this);
  }
  local_50.d.d = (Data *)((ulong)((int)lVar3 + 1) | lVar5 + lVar3 & 0xffffffff00000000U);
  QWidget::resize((QWidget *)this,(QSize *)&local_50);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void  QTipLabel::updateSize(const QPoint &pos)
{
    d_func()->setScreenForPoint(pos);
    // Ensure that we get correct sizeHints by placing this window on the right screen.
    QFontMetrics fm(font());
    QSize extra(1, 0);
    // Make it look good with the default ToolTip font on Mac, which has a small descent.
    if (fm.descent() == 2 && fm.ascent() >= 11)
        ++extra.rheight();
    setWordWrap(Qt::mightBeRichText(text()));
    QSize sh = sizeHint();
    const QScreen *screen = getTipScreen(pos, this);
    if (!wordWrap() && sh.width() > screen->geometry().width()) {
        setWordWrap(true);
        sh = sizeHint();
    }
    resize(sh + extra);
}